

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O2

spv_result_t spvtools::val::PerformCfgChecks(ValidationState_t *_)

{
  uint32_t uVar1;
  pointer pFVar2;
  pointer ppVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  spv_result_t sVar7;
  vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_> *pvVar8;
  size_t sVar9;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar10;
  BasicBlock *pBVar11;
  pointer ppBVar12;
  __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
  _Var13;
  Instruction *pIVar14;
  pointer ppBVar15;
  pointer ppVar16;
  BasicBlock *pBVar17;
  __node_base *p_Var18;
  pointer this;
  spv_result_t local_514;
  vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  postorder;
  BasicBlock *idom;
  BasicBlock *local_4d8;
  string undef_blocks;
  _Any_data local_4a8;
  code *local_498;
  code *local_490;
  _Any_data local_488;
  code *local_478;
  code *local_470;
  _Any_data local_468;
  code *local_458;
  code *local_450;
  _Any_data local_448;
  code *local_438;
  code *local_430;
  _Any_data local_428;
  code *local_418;
  code *local_410;
  _Any_data local_408;
  code *local_3f8;
  code *local_3f0;
  _Any_data local_3e8;
  code *local_3d8;
  code *local_3d0;
  _Any_data local_3c8;
  code *local_3b8;
  code *local_3b0;
  _Any_data local_3a8;
  code *local_398;
  code *local_390;
  _Any_data local_388;
  code *local_378;
  code *local_370;
  vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
  edges_1;
  _Any_data local_348;
  code *local_338;
  code *local_330;
  _Any_data local_328;
  code *local_318;
  code *local_310;
  _Any_data local_308;
  code *local_2f8;
  code *local_2f0;
  _Any_data local_2e8;
  code *local_2d8;
  _Any_data local_2c8;
  code *local_2b8;
  _Any_data local_2a8;
  code *local_298;
  _Any_data local_288;
  code *local_278;
  _Any_data local_268;
  code *local_258;
  _Any_data local_248;
  code *local_238;
  _Any_data local_228;
  code *local_218;
  vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
  edges;
  spv_result_t local_38;
  
  pvVar8 = ValidationState_t::functions(_);
  this = (pvVar8->
         super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>).
         _M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (pvVar8->
           super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this == pFVar2) {
      sVar7 = MaximalReconvergenceChecks(_);
      return sVar7;
    }
    sVar9 = Function::undefined_block_count(this);
    if (sVar9 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&undef_blocks,"{",(allocator<char> *)&edges);
      p_Var18 = &(this->undefined_blocks_)._M_h._M_before_begin;
      bVar4 = true;
      while (p_Var18 = p_Var18->_M_nxt, p_Var18 != (__node_base *)0x0) {
        ValidationState_t::getIdName_abi_cxx11_
                  ((string *)&edges,_,(uint32_t)*(size_type *)(p_Var18 + 1));
        std::__cxx11::string::append((string *)&undef_blocks);
        std::__cxx11::string::_M_dispose();
        bVar5 = !bVar4;
        bVar4 = false;
        if (bVar5) {
          std::__cxx11::string::append((char *)&undef_blocks);
          bVar4 = false;
        }
      }
      pIVar14 = ValidationState_t::FindDef(_,this->id_);
      ValidationState_t::diag((DiagnosticStream *)&edges,_,SPV_ERROR_INVALID_CFG,pIVar14);
      std::operator<<((ostream *)&edges,"Block(s) ");
      std::operator<<((ostream *)&edges,(string *)&undef_blocks);
      std::operator<<((ostream *)&edges,"}");
      std::operator<<((ostream *)&edges," are referenced but not defined in function ");
      ValidationState_t::getIdName_abi_cxx11_((string *)&edges_1,_,this->id_);
      std::operator<<((ostream *)&edges,(string *)&edges_1);
      std::__cxx11::string::_M_dispose();
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&edges);
      std::__cxx11::string::_M_dispose();
      return local_38;
    }
    postorder.
    super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    postorder.
    super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    postorder.
    super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pvVar10 = Function::ordered_blocks(this);
    if ((pvVar10->
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (pvVar10->
        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      pBVar11 = Function::first_block(this);
      Function::AugmentedCFGSuccessorsFunction(this);
      local_388._M_unused._M_object = (void *)0x0;
      local_388._8_8_ = 0;
      local_448._8_8_ = 0;
      local_370 = std::
                  _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1003:25)>
                  ::_M_invoke;
      local_378 = std::
                  _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1003:25)>
                  ::_M_manager;
      local_430 = std::
                  _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1009:25)>
                  ::_M_invoke;
      local_438 = std::
                  _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1009:25)>
                  ::_M_manager;
      local_3a8._M_unused._M_object = (void *)0x0;
      local_3a8._8_8_ = 0;
      local_390 = std::
                  _Function_handler<bool_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1004:31)>
                  ::_M_invoke;
      local_398 = std::
                  _Function_handler<bool_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1004:31)>
                  ::_M_manager;
      local_448._M_unused._M_object = &postorder;
      CFA<spvtools::val::BasicBlock>::DepthFirstTraversal
                (pBVar11,(get_blocks_func *)&local_288,
                 (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_388,
                 (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_448,
                 (function<bool_(const_spvtools::val::BasicBlock_*)> *)&local_3a8);
      if (local_398 != (code *)0x0) {
        (*local_398)(&local_3a8,&local_3a8,__destroy_functor);
      }
      if (local_438 != (code *)0x0) {
        (*local_438)(&local_448,&local_448,__destroy_functor);
      }
      if (local_378 != (code *)0x0) {
        (*local_378)(&local_388,&local_388,__destroy_functor);
      }
      if (local_278 != (code *)0x0) {
        (*local_278)(&local_288,&local_288,__destroy_functor);
      }
      Function::AugmentedCFGPredecessorsFunction(this);
      CFA<spvtools::val::BasicBlock>::CalculateDominators
                (&edges,&postorder,(get_blocks_func *)&local_228);
      ppVar16 = edges.
                super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 = edges.
               super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_218 != (code *)0x0) {
        (*local_218)(&local_228,&local_228,__destroy_functor);
        ppVar16 = edges.
                  super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar3 = edges.
                 super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; ppVar16 != ppVar3; ppVar16 = ppVar16 + 1) {
        if (ppVar16->first != ppVar16->second) {
          BasicBlock::SetImmediateDominator(ppVar16->first,ppVar16->second);
        }
      }
      std::
      _Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
      ::~_Vector_base(&edges.
                       super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                     );
    }
    pvVar10 = Function::ordered_blocks(this);
    ppBVar15 = (pvVar10->
               super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    ppBVar12 = (pvVar10->
               super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    if (ppBVar15 != ppBVar12) {
      while (ppBVar15 = ppBVar15 + 1, ppBVar15 != ppBVar12) {
        idom = BasicBlock::immediate_dominator(*ppBVar15);
        if ((idom != &this->pseudo_entry_block_ && idom != (BasicBlock *)0x0) &&
           (_Var13 = std::
                     __find_if<__gnu_cxx::__normal_iterator<spvtools::val::BasicBlock**,std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>,__gnu_cxx::__ops::_Iter_equals_val<spvtools::val::BasicBlock*const>>
                               ((pvVar10->
                                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                                )._M_impl.super__Vector_impl_data._M_start,ppBVar15,
                                (_Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                                 *)&idom), ppBVar15 == _Var13._M_current)) {
          pIVar14 = ValidationState_t::FindDef(_,idom->id_);
          ValidationState_t::diag((DiagnosticStream *)&edges,_,SPV_ERROR_INVALID_CFG,pIVar14);
          std::operator<<((ostream *)&edges,"Block ");
          ValidationState_t::getIdName_abi_cxx11_(&undef_blocks,_,(*ppBVar15)->id_);
          std::operator<<((ostream *)&edges,(string *)&undef_blocks);
          std::operator<<((ostream *)&edges," appears in the binary before its dominator ");
          ValidationState_t::getIdName_abi_cxx11_((string *)&edges_1,_,idom->id_);
          std::operator<<((ostream *)&edges,(string *)&edges_1);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          goto LAB_00536268;
        }
        ppBVar12 = (pvVar10->
                   super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
      }
      bVar4 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
      if (bVar4) {
        uVar1 = (_->options_->universal_limits_).max_control_flow_nesting_depth;
        ppBVar15 = (pvVar10->
                   super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
LAB_00535bf9:
        if (ppBVar15 !=
            (pvVar10->
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          iVar6 = Function::GetBlockDepth(this,*ppBVar15);
          if (iVar6 <= (int)uVar1) break;
          pIVar14 = ValidationState_t::FindDef(_,(*ppBVar15)->id_);
          ValidationState_t::diag((DiagnosticStream *)&edges,_,SPV_ERROR_INVALID_CFG,pIVar14);
          std::operator<<((ostream *)&edges,"Maximum Control Flow nesting depth exceeded.");
LAB_00536268:
          local_514 = local_38;
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&edges);
          bVar4 = false;
          goto LAB_0053626f;
        }
      }
    }
    bVar5 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
    bVar4 = true;
    if (bVar5) {
      if (postorder.
          super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          postorder.
          super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        postorder.
        super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             postorder.
             super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      edges.
      super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      edges.
      super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      edges.
      super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      undef_blocks._M_dataplus._M_p = (pointer)0x0;
      undef_blocks._M_string_length = 0;
      undef_blocks.field_2._M_allocated_capacity = 0;
      pvVar10 = Function::ordered_blocks(this);
      if ((pvVar10->
          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (pvVar10->
          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        pBVar11 = Function::first_block(this);
        Function::AugmentedStructuralCFGSuccessorsFunction(this);
        local_3c8._M_unused._M_object = (void *)0x0;
        local_3c8._8_8_ = 0;
        local_468._8_8_ = 0;
        local_3b0 = std::
                    _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1003:25)>
                    ::_M_invoke;
        local_3b8 = std::
                    _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1003:25)>
                    ::_M_manager;
        local_450 = std::
                    _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1060:13)>
                    ::_M_invoke;
        local_458 = std::
                    _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1060:13)>
                    ::_M_manager;
        local_308._M_unused._M_object = (void *)0x0;
        local_308._8_8_ = 0;
        local_2f0 = std::
                    _Function_handler<bool_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1004:31)>
                    ::_M_invoke;
        local_2f8 = std::
                    _Function_handler<bool_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1004:31)>
                    ::_M_manager;
        local_468._M_unused._M_object = &postorder;
        CFA<spvtools::val::BasicBlock>::DepthFirstTraversal
                  (pBVar11,(get_blocks_func *)&local_2a8,
                   (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_3c8,
                   (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_468,
                   (function<bool_(const_spvtools::val::BasicBlock_*)> *)&local_308);
        if (local_2f8 != (code *)0x0) {
          (*local_2f8)(&local_308,&local_308,__destroy_functor);
        }
        if (local_458 != (code *)0x0) {
          (*local_458)(&local_468,&local_468,__destroy_functor);
        }
        if (local_3b8 != (code *)0x0) {
          (*local_3b8)(&local_3c8,&local_3c8,__destroy_functor);
        }
        if (local_298 != (code *)0x0) {
          (*local_298)(&local_2a8,&local_2a8,__destroy_functor);
        }
        Function::AugmentedStructuralCFGPredecessorsFunction(this);
        CFA<spvtools::val::BasicBlock>::CalculateDominators
                  (&edges_1,&postorder,(get_blocks_func *)&local_248);
        ppVar16 = edges_1.
                  super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar3 = edges_1.
                 super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_238 != (code *)0x0) {
          (*local_238)(&local_248,&local_248,__destroy_functor);
          ppVar16 = edges_1.
                    super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar3 = edges_1.
                   super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; ppVar16 != ppVar3; ppVar16 = ppVar16 + 1) {
          if (ppVar16->first != ppVar16->second) {
            BasicBlock::SetImmediateStructuralDominator(ppVar16->first,ppVar16->second);
          }
        }
        Function::AugmentedStructuralCFGPredecessorsFunction(this);
        local_3e8._M_unused._M_object = (void *)0x0;
        local_3e8._8_8_ = 0;
        local_488._8_8_ = 0;
        local_3d0 = std::
                    _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1003:25)>
                    ::_M_invoke;
        local_3d8 = std::
                    _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1003:25)>
                    ::_M_manager;
        local_488._M_unused._M_object = &edges;
        local_470 = std::
                    _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1073:13)>
                    ::_M_invoke;
        local_478 = std::
                    _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1073:13)>
                    ::_M_manager;
        local_328._M_unused._M_object = (void *)0x0;
        local_328._8_8_ = 0;
        local_310 = std::
                    _Function_handler<bool_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1004:31)>
                    ::_M_invoke;
        local_318 = std::
                    _Function_handler<bool_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1004:31)>
                    ::_M_manager;
        CFA<spvtools::val::BasicBlock>::DepthFirstTraversal
                  (&this->pseudo_exit_block_,(get_blocks_func *)&local_2c8,
                   (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_3e8,
                   (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_488,
                   (function<bool_(const_spvtools::val::BasicBlock_*)> *)&local_328);
        if (local_318 != (code *)0x0) {
          (*local_318)(&local_328,&local_328,__destroy_functor);
        }
        if (local_478 != (code *)0x0) {
          (*local_478)(&local_488,&local_488,__destroy_functor);
        }
        if (local_3d8 != (code *)0x0) {
          (*local_3d8)(&local_3e8,&local_3e8,__destroy_functor);
        }
        if (local_2b8 != (code *)0x0) {
          (*local_2b8)(&local_2c8,&local_2c8,__destroy_functor);
        }
        Function::AugmentedStructuralCFGSuccessorsFunction(this);
        CFA<spvtools::val::BasicBlock>::CalculateDominators
                  ((vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                    *)&idom,(vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                             *)&edges,(get_blocks_func *)&local_268);
        pBVar17 = idom;
        pBVar11 = local_4d8;
        if (local_258 != (code *)0x0) {
          (*local_258)(&local_268,&local_268,__destroy_functor);
          pBVar17 = idom;
          pBVar11 = local_4d8;
        }
        for (; pBVar17 != pBVar11; pBVar17 = (BasicBlock *)&pBVar17->immediate_structural_dominator_
            ) {
          BasicBlock::SetImmediateStructuralPostDominator
                    (*(BasicBlock **)pBVar17,pBVar17->immediate_dominator_);
        }
        Function::AugmentedStructuralCFGSuccessorsFunction(this);
        local_408._M_unused._M_object = (void *)0x0;
        local_408._8_8_ = 0;
        local_3f0 = std::
                    _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1003:25)>
                    ::_M_invoke;
        local_3f8 = std::
                    _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1003:25)>
                    ::_M_manager;
        local_428._M_unused._M_object = (void *)0x0;
        local_428._8_8_ = 0;
        local_4a8._8_8_ = 0;
        local_410 = std::
                    _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1003:25)>
                    ::_M_invoke;
        local_418 = std::
                    _Function_handler<void_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1003:25)>
                    ::_M_manager;
        local_4a8._M_unused._M_object = &undef_blocks;
        local_490 = std::
                    _Function_handler<void_(const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1086:13)>
                    ::_M_invoke;
        local_498 = std::
                    _Function_handler<void_(const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1086:13)>
                    ::_M_manager;
        local_348._M_unused._M_object = (void *)0x0;
        local_348._8_8_ = 0;
        local_330 = std::
                    _Function_handler<bool_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1004:31)>
                    ::_M_invoke;
        local_338 = std::
                    _Function_handler<bool_(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_cfg.cpp:1004:31)>
                    ::_M_manager;
        CFA<spvtools::val::BasicBlock>::DepthFirstTraversal
                  (&this->pseudo_entry_block_,(get_blocks_func *)&local_2e8,
                   (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_408,
                   (function<void_(const_spvtools::val::BasicBlock_*)> *)&local_428,
                   (function<void_(const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*)>
                    *)&local_4a8,(function<bool_(const_spvtools::val::BasicBlock_*)> *)&local_348);
        if (local_338 != (code *)0x0) {
          (*local_338)(&local_348,&local_348,__destroy_functor);
        }
        if (local_498 != (code *)0x0) {
          (*local_498)(&local_4a8,&local_4a8,__destroy_functor);
        }
        if (local_418 != (code *)0x0) {
          (*local_418)(&local_428,&local_428,__destroy_functor);
        }
        if (local_3f8 != (code *)0x0) {
          (*local_3f8)(&local_408,&local_408,__destroy_functor);
        }
        if (local_2d8 != (code *)0x0) {
          (*local_2d8)(&local_2e8,&local_2e8,__destroy_functor);
        }
        std::
        _Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
        ::~_Vector_base((_Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                         *)&idom);
        std::
        _Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
        ::~_Vector_base(&edges_1.
                         super__Vector_base<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
                       );
      }
      UpdateContinueConstructExitBlocks
                (this,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&undef_blocks);
      sVar7 = StructuredControlFlowChecks
                        (_,this,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 *)&undef_blocks,&postorder);
      std::
      _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&undef_blocks);
      std::
      _Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
      ::~_Vector_base((_Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                       *)&edges);
      bVar4 = sVar7 == SPV_SUCCESS;
      if (!bVar4) {
        local_514 = sVar7;
      }
    }
LAB_0053626f:
    std::
    _Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
    ::~_Vector_base(&postorder.
                     super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                   );
    if (!bVar4) {
      return local_514;
    }
    this = this + 1;
  } while( true );
  ppBVar15 = ppBVar15 + 1;
  goto LAB_00535bf9;
}

Assistant:

spv_result_t PerformCfgChecks(ValidationState_t& _) {
  for (auto& function : _.functions()) {
    // Check all referenced blocks are defined within a function
    if (function.undefined_block_count() != 0) {
      std::string undef_blocks("{");
      bool first = true;
      for (auto undefined_block : function.undefined_blocks()) {
        undef_blocks += _.getIdName(undefined_block);
        if (!first) {
          undef_blocks += " ";
        }
        first = false;
      }
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(function.id()))
             << "Block(s) " << undef_blocks << "}"
             << " are referenced but not defined in function "
             << _.getIdName(function.id());
    }

    // Set each block's immediate dominator.
    //
    // We want to analyze all the blocks in the function, even in degenerate
    // control flow cases including unreachable blocks.  So use the augmented
    // CFG to ensure we cover all the blocks.
    std::vector<const BasicBlock*> postorder;
    auto ignore_block = [](const BasicBlock*) {};
    auto no_terminal_blocks = [](const BasicBlock*) { return false; };
    if (!function.ordered_blocks().empty()) {
      /// calculate dominators
      CFA<BasicBlock>::DepthFirstTraversal(
          function.first_block(), function.AugmentedCFGSuccessorsFunction(),
          ignore_block, [&](const BasicBlock* b) { postorder.push_back(b); },
          no_terminal_blocks);
      auto edges = CFA<BasicBlock>::CalculateDominators(
          postorder, function.AugmentedCFGPredecessorsFunction());
      for (auto edge : edges) {
        if (edge.first != edge.second)
          edge.first->SetImmediateDominator(edge.second);
      }
    }

    auto& blocks = function.ordered_blocks();
    if (!blocks.empty()) {
      // Check if the order of blocks in the binary appear before the blocks
      // they dominate
      for (auto block = begin(blocks) + 1; block != end(blocks); ++block) {
        if (auto idom = (*block)->immediate_dominator()) {
          if (idom != function.pseudo_entry_block() &&
              block == std::find(begin(blocks), block, idom)) {
            return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(idom->id()))
                   << "Block " << _.getIdName((*block)->id())
                   << " appears in the binary before its dominator "
                   << _.getIdName(idom->id());
          }
        }
      }
      // If we have structured control flow, check that no block has a control
      // flow nesting depth larger than the limit.
      if (_.HasCapability(spv::Capability::Shader)) {
        const int control_flow_nesting_depth_limit =
            _.options()->universal_limits_.max_control_flow_nesting_depth;
        for (auto block = begin(blocks); block != end(blocks); ++block) {
          if (function.GetBlockDepth(*block) >
              control_flow_nesting_depth_limit) {
            return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef((*block)->id()))
                   << "Maximum Control Flow nesting depth exceeded.";
          }
        }
      }
    }

    /// Structured control flow checks are only required for shader capabilities
    if (_.HasCapability(spv::Capability::Shader)) {
      // Calculate structural dominance.
      postorder.clear();
      std::vector<const BasicBlock*> postdom_postorder;
      std::vector<std::pair<uint32_t, uint32_t>> back_edges;
      if (!function.ordered_blocks().empty()) {
        /// calculate dominators
        CFA<BasicBlock>::DepthFirstTraversal(
            function.first_block(),
            function.AugmentedStructuralCFGSuccessorsFunction(), ignore_block,
            [&](const BasicBlock* b) { postorder.push_back(b); },
            no_terminal_blocks);
        auto edges = CFA<BasicBlock>::CalculateDominators(
            postorder, function.AugmentedStructuralCFGPredecessorsFunction());
        for (auto edge : edges) {
          if (edge.first != edge.second)
            edge.first->SetImmediateStructuralDominator(edge.second);
        }

        /// calculate post dominators
        CFA<BasicBlock>::DepthFirstTraversal(
            function.pseudo_exit_block(),
            function.AugmentedStructuralCFGPredecessorsFunction(), ignore_block,
            [&](const BasicBlock* b) { postdom_postorder.push_back(b); },
            no_terminal_blocks);
        auto postdom_edges = CFA<BasicBlock>::CalculateDominators(
            postdom_postorder,
            function.AugmentedStructuralCFGSuccessorsFunction());
        for (auto edge : postdom_edges) {
          edge.first->SetImmediateStructuralPostDominator(edge.second);
        }
        /// calculate back edges.
        CFA<BasicBlock>::DepthFirstTraversal(
            function.pseudo_entry_block(),
            function.AugmentedStructuralCFGSuccessorsFunction(), ignore_block,
            ignore_block,
            [&](const BasicBlock* from, const BasicBlock* to) {
              // A back edge must be a real edge. Since the augmented successors
              // contain structural edges, filter those from consideration.
              for (const auto* succ : *(from->successors())) {
                if (succ == to) back_edges.emplace_back(from->id(), to->id());
              }
            },
            no_terminal_blocks);
      }
      UpdateContinueConstructExitBlocks(function, back_edges);

      if (auto error =
              StructuredControlFlowChecks(_, &function, back_edges, postorder))
        return error;
    }
  }

  if (auto error = MaximalReconvergenceChecks(_)) {
    return error;
  }

  return SPV_SUCCESS;
}